

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O3

void __thiscall
QStringMatcher::QStringMatcher(QStringMatcher *this,QString *pattern,CaseSensitivity cs)

{
  Data *pDVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  QStringView needle;
  
  this->d_ptr = (QStringMatcherPrivate *)0x0;
  this->q_cs = cs;
  pDVar1 = (pattern->d).d;
  (this->q_pattern).d.d = pDVar1;
  pcVar3 = (pattern->d).ptr;
  (this->q_pattern).d.ptr = pcVar3;
  qVar2 = (pattern->d).size;
  (this->q_pattern).d.size = qVar2;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pcVar3 = (this->q_pattern).d.ptr;
    qVar2 = (this->q_pattern).d.size;
    cs = this->q_cs;
  }
  memset(this->q_skiptable,0,0x100);
  (this->q_sv).m_size = qVar2;
  (this->q_sv).m_data = pcVar3;
  needle.m_data = pcVar3;
  needle.m_size = qVar2;
  bm_init_skiptable(needle,this->q_skiptable,cs);
  return;
}

Assistant:

QStringMatcher::QStringMatcher(const QString &pattern, Qt::CaseSensitivity cs)
    : d_ptr(nullptr), q_cs(cs), q_pattern(pattern)
{
    q_sv = q_pattern;
    updateSkipTable();
}